

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  void *pvVar1;
  TTDVar var;
  code *pcVar2;
  undefined8 this;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  ScriptContext *pSVar6;
  ScriptFunction *function;
  FunctionBody *this_00;
  Recycler *this_01;
  undefined4 *puVar7;
  Type *frameSlotArray;
  Var pvVar8;
  RegSlot slotCount;
  size_t size;
  Type *addr;
  ulong uVar9;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  pSVar6 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag != SnapGenerator) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  pvVar1 = snpObject->AddtlSnapObjectInfo;
  if ((*(TTD_PTR_ID *)((long)pvVar1 + 0x18) == 0) ||
     (function = (ScriptFunction *)
                 InflateMap::LookupObject(inflator,*(TTD_PTR_ID *)((long)pvVar1 + 0x18)),
     function == (ScriptFunction *)0x0)) {
    if (*(int *)&obj[2].type.ptr != 3) {
      TTDAbort_unrecoverable_error
                ("Unexpected null scriptFunction when generator is not in completed state");
    }
  }
  else {
    Memory::Recycler::WBSetBit((char *)(obj + 4));
    obj[4].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)function;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(obj + 4);
    this_00 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
    Js::FunctionBody::EnsureDynamicProfileInfo(this_00);
    bVar3 = Js::InterpreterStackFrame::ShouldDoProfile(this_00);
    data._32_8_ = Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator
                            (function,this_00,(JavascriptGenerator *)obj,bVar3);
    if ((InterpreterStackFrame *)
        obj[2].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
        (InterpreterStackFrame *)data._32_8_) {
      TTDAbort_unrecoverable_error("unexpected frame mis-match");
    }
    if ((ulong)*(uint *)((long)pvVar1 + 4) == 0) {
      frameSlotArray = (Type *)0x0;
      slotCount = 0;
    }
    else {
      local_70 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_4276212;
      data.filename._0_4_ = 0x909;
      data.plusSize = (ulong)*(uint *)((long)pvVar1 + 4);
      this_01 = Memory::Recycler::TrackAllocInfo(pSVar6->recycler,(TrackAllocData *)local_70);
      uVar5 = *(uint *)((long)pvVar1 + 4);
      if ((ulong)uVar5 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(this_01,(TrackAllocData *)0x0);
        frameSlotArray = (Type *)&DAT_00000008;
      }
      else {
        BVar4 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_0090e733;
          *puVar7 = 0;
        }
        size = (ulong)uVar5 << 3;
        frameSlotArray =
             (Type *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                               (this_01,size);
        if (frameSlotArray == (Type *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) {
LAB_0090e733:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        memset(frameSlotArray,0,size);
      }
      uVar5 = *(uint *)((long)pvVar1 + 4);
      slotCount = 0;
      if (uVar5 != 0) {
        uVar9 = 0;
        addr = frameSlotArray;
        do {
          var = *(TTDVar *)(*(long *)((long)pvVar1 + 8) + uVar9 * 8);
          if (var == (TTDVar)0x0) {
            addr->ptr = (void *)0x0;
          }
          else {
            pvVar8 = InflateMap::InflateTTDVar(inflator,var);
            Memory::Recycler::WBSetBit((char *)addr);
            addr->ptr = pvVar8;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
            uVar5 = *(uint *)((long)pvVar1 + 4);
          }
          uVar9 = uVar9 + 1;
          addr = addr + 1;
          slotCount = uVar5;
        } while (uVar9 < uVar5);
      }
    }
    if (*(int *)((long)pvVar1 + 0x38) != 0) {
      Js::JavascriptGenerator::SetFrameSlots((JavascriptGenerator *)obj,slotCount,frameSlotArray);
      this = data._32_8_;
      Js::InterpreterStackFrame::InitializeClosures((InterpreterStackFrame *)data._32_8_);
      Js::ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,*(int *)((long)pvVar1 + 0x38));
    }
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapGeneratorInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            Js::JavascriptGenerator* generator = reinterpret_cast<Js::JavascriptGenerator*>(obj);

            SnapGeneratorInfo* generatorInfo = SnapObjectGetAddtlInfoAs<SnapGeneratorInfo*, SnapObjectType::SnapGenerator>(snpObject);
            Js::ScriptFunction* scriptFunction = reinterpret_cast<Js::ScriptFunction*>((generatorInfo->scriptFunction != TTD_INVALID_PTR_ID) ? inflator->LookupObject(generatorInfo->scriptFunction) : nullptr);
            if (scriptFunction != nullptr)
            {
                generator->SetScriptFunction(scriptFunction);
                Js::FunctionBody* executeFunction = scriptFunction->GetFunctionBody();

#if ENABLE_PROFILE_INFO
                // call EnsureDynamicProfileInfo or we get asserts in some cases when creating the InterpreterStackFrame
                executeFunction->EnsureDynamicProfileInfo();
#endif
                bool doProfile = Js::InterpreterStackFrame::ShouldDoProfile(executeFunction);

                Js::InterpreterStackFrame* frame = Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator(scriptFunction, executeFunction, generator, doProfile);
                TTDAssert(generator->GetFrame() == frame, "unexpected frame mis-match");

                Field(Js::Var)* frameSlotArray = nullptr;
                if (generatorInfo->frame_slotCount != 0)
                {
                    frameSlotArray = RecyclerNewArray(ctx->GetRecycler(), Field(Js::Var), generatorInfo->frame_slotCount);

                    for (Js::RegSlot i = 0; i < generatorInfo->frame_slotCount; i++)
                    {
                        if (generatorInfo->frame_slotArray[i] != nullptr)
                        {
                            frameSlotArray[i] = inflator->InflateTTDVar(generatorInfo->frame_slotArray[i]);
                        }
                        else
                        {
                            frameSlotArray[i] = nullptr;
                        }
                    }
                }

                if (generatorInfo->byteCodeReader_offset > 0)
                {
                    generator->SetFrameSlots(generatorInfo->frame_slotCount, frameSlotArray);
                    frame->InitializeClosures();
                    frame->GetReader()->SetCurrentOffset(generatorInfo->byteCodeReader_offset);
                }
            }
            else
            {
                TTDAssert(generator->IsCompleted(), "Unexpected null scriptFunction when generator is not in completed state");
            }
        }